

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

void __thiscall BasePort::~BasePort(BasePort *this)

{
  this->_vptr_BasePort = (_func_int **)&PTR___cxa_pure_virtual_00123638;
  if (this->ReadBufferBroadcast != (uchar *)0x0) {
    operator_delete__(this->ReadBufferBroadcast);
  }
  if (this->WriteBufferBroadcast != (uchar *)0x0) {
    operator_delete__(this->WriteBufferBroadcast);
  }
  if (this->GenericBuffer != (uchar *)0x0) {
    operator_delete__(this->GenericBuffer);
    return;
  }
  return;
}

Assistant:

BasePort::~BasePort()
{
    delete [] ReadBufferBroadcast;
    delete [] WriteBufferBroadcast;
    delete [] GenericBuffer;
}